

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::Version::~Version(Version *this)

{
  int iVar1;
  Version *pVVar2;
  FileMetaData *pFVar3;
  pointer pcVar4;
  void *pvVar5;
  pointer ppFVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->refs_ != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x44,"leveldb::Version::~Version()");
  }
  pVVar2 = this->prev_;
  pVVar2->next_ = this->next_;
  this->next_->prev_ = pVVar2;
  lVar8 = 0;
  do {
    ppFVar6 = this->files_[lVar8].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this->files_[lVar8].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar6) {
      uVar7 = 0;
      do {
        pFVar3 = ppFVar6[uVar7];
        iVar1 = pFVar3->refs;
        if (iVar1 < 1) {
          __assert_fail("f->refs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                        ,0x4e,"leveldb::Version::~Version()");
        }
        pFVar3->refs = iVar1 + -1;
        if (iVar1 == 1) {
          pcVar4 = (pFVar3->largest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &(pFVar3->largest).rep_.field_2) {
            operator_delete(pcVar4);
          }
          pcVar4 = (pFVar3->smallest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &(pFVar3->smallest).rep_.field_2) {
            operator_delete(pcVar4);
          }
          operator_delete(pFVar3);
        }
        uVar7 = uVar7 + 1;
        ppFVar6 = this->files_[lVar8].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)this->files_[lVar8].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3
                              ));
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  lVar8 = 0xb0;
  do {
    pvVar5 = *(void **)((long)this->files_ + lVar8 + -0x20);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 8);
  return;
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}